

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::getSubgridStartY(PFData *this,int gridIdx)

{
  int *piVar1;
  int in_ESI;
  PFData *in_RDI;
  int offset;
  int start;
  int size;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_c[0] = in_ESI;
  local_10 = getNormalBlockSizeY(in_RDI);
  local_14 = in_RDI->m_ny % in_RDI->m_q;
  local_18 = local_10 + 1;
  piVar1 = std::min<int>(local_c,&local_14);
  local_18 = local_18 * *piVar1;
  if (local_14 <= local_c[0]) {
    local_18 = local_10 * (local_c[0] - local_14) + local_18;
  }
  return local_18;
}

Assistant:

int PFData::getSubgridStartY(int gridIdx) const{
    const int size = getNormalBlockSizeY();
    const int start = m_ny % m_q;

    //Remainder blocks
    int offset = (size+1) * std::min(gridIdx, start);

    //Normal blocks
    if(gridIdx >= start){
        offset += size * (gridIdx - start);
    }

    return offset;
}